

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrMultisamplePixelBufferAccess.cpp
# Opt level: O3

MultisampleConstPixelBufferAccess *
rr::getSubregion(MultisampleConstPixelBufferAccess *__return_storage_ptr__,
                MultisampleConstPixelBufferAccess *access,int x,int y,int width,int height)

{
  ConstPixelBufferAccess local_38;
  
  tcu::getSubregion(&local_38,&access->m_access,0,x,y,(access->m_access).m_size.m_data[0],width,
                    height);
  (__return_storage_ptr__->m_access).m_format = local_38.m_format;
  (__return_storage_ptr__->m_access).m_size.m_data[2] = local_38.m_size.m_data[2];
  *(undefined8 *)(__return_storage_ptr__->m_access).m_size.m_data = local_38.m_size.m_data._0_8_;
  *(undefined8 *)(__return_storage_ptr__->m_access).m_pitch.m_data = local_38.m_pitch.m_data._0_8_;
  (__return_storage_ptr__->m_access).m_pitch.m_data[2] = local_38.m_pitch.m_data[2];
  (__return_storage_ptr__->m_access).m_data = local_38.m_data;
  return __return_storage_ptr__;
}

Assistant:

MultisampleConstPixelBufferAccess getSubregion (const MultisampleConstPixelBufferAccess& access, int x, int y, int width, int height)
{
	return MultisampleConstPixelBufferAccess::fromMultisampleAccess(tcu::getSubregion(access.raw(), 0, x, y, access.getNumSamples(), width, height));
}